

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O3

void __thiscall ipx::Iterate::ComputeComplementarity(Iterate *this)

{
  Int *pIVar1;
  int iVar2;
  pointer pSVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  iVar7 = this->model_->num_cols_;
  pIVar1 = &this->model_->num_rows_;
  iVar2 = *pIVar1;
  uVar8 = iVar7 + *pIVar1;
  this->complementarity_ = 0.0;
  this->mu_min_ = INFINITY;
  this->mu_max_ = 0.0;
  if (uVar8 != 0 && SCARRY4(iVar7,iVar2) == (int)uVar8 < 0) {
    pSVar3 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->xl_)._M_data;
    pdVar5 = (this->zl_)._M_data;
    dVar12 = INFINITY;
    dVar10 = 0.0;
    uVar9 = 0;
    iVar7 = 0;
    dVar11 = 0.0;
    do {
      if ((pSVar3[uVar9] & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar10 = dVar10 + pdVar4[uVar9] * pdVar5[uVar9];
        this->complementarity_ = dVar10;
        dVar6 = pdVar4[uVar9] * pdVar5[uVar9];
        if (dVar12 <= pdVar4[uVar9] * pdVar5[uVar9]) {
          dVar6 = dVar12;
        }
        dVar12 = dVar6;
        this->mu_min_ = dVar12;
        dVar6 = pdVar4[uVar9] * pdVar5[uVar9];
        if (pdVar4[uVar9] * pdVar5[uVar9] <= dVar11) {
          dVar6 = dVar11;
        }
        dVar11 = dVar6;
        this->mu_max_ = dVar11;
        iVar7 = iVar7 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
    if (0 < (int)uVar8) {
      pSVar3 = (this->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (this->xu_)._M_data;
      pdVar5 = (this->zu_)._M_data;
      uVar9 = 0;
      do {
        if (pSVar3[uVar9] - BARRIER_UB < 2) {
          dVar10 = dVar10 + pdVar4[uVar9] * pdVar5[uVar9];
          this->complementarity_ = dVar10;
          dVar6 = pdVar4[uVar9] * pdVar5[uVar9];
          if (dVar12 <= pdVar4[uVar9] * pdVar5[uVar9]) {
            dVar6 = dVar12;
          }
          dVar12 = dVar6;
          this->mu_min_ = dVar12;
          dVar6 = pdVar4[uVar9] * pdVar5[uVar9];
          if (pdVar4[uVar9] * pdVar5[uVar9] <= dVar11) {
            dVar6 = dVar11;
          }
          dVar11 = dVar6;
          this->mu_max_ = dVar11;
          iVar7 = iVar7 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if (0 < iVar7) {
      dVar10 = dVar10 / (double)iVar7;
      goto LAB_0039f2a3;
    }
  }
  this->mu_min_ = 0.0;
  dVar10 = 0.0;
LAB_0039f2a3:
  this->mu_ = dVar10;
  return;
}

Assistant:

void Iterate::ComputeComplementarity() const {
    const Int m = model_.rows();
    const Int n = model_.cols();

    complementarity_ = 0.0;
    mu_min_ = INFINITY;
    mu_max_ = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (has_barrier_lb(j)) {
            complementarity_ += xl_[j] * zl_[j];
            mu_min_ = std::min(mu_min_, xl_[j]*zl_[j]);
            mu_max_ = std::max(mu_max_, xl_[j]*zl_[j]);
            num_finite++;
        }
    }
    for (Int j = 0; j < n+m; j++) {
        if (has_barrier_ub(j)) {
            complementarity_ += xu_[j] * zu_[j];
            mu_min_ = std::min(mu_min_, xu_[j]*zu_[j]);
            mu_max_ = std::max(mu_max_, xu_[j]*zu_[j]);
            num_finite++;
        }
    }
    if (num_finite > 0)
        mu_ = complementarity_ / num_finite;
    else
        mu_ = mu_min_ = 0.0;
}